

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonRemoveAllNulls(JsonNode *pNode)

{
  JsonNode *pNode_00;
  u32 uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  uVar1 = pNode->n;
  if (1 < (int)uVar1) {
    iVar4 = 2;
    do {
      pNode_00 = pNode + iVar4;
      bVar2 = pNode[iVar4].eType;
      if (bVar2 == 7) {
        jsonRemoveAllNulls(pNode_00);
        bVar2 = pNode_00->eType;
LAB_001a1b2d:
        iVar3 = 2;
        if (5 < bVar2) {
          iVar3 = pNode_00->n + 2;
        }
      }
      else {
        if (bVar2 != 0) goto LAB_001a1b2d;
        pNode_00->jnFlags = pNode_00->jnFlags | 4;
        iVar3 = 2;
      }
      iVar4 = iVar4 + iVar3;
    } while (iVar4 <= (int)uVar1);
  }
  return;
}

Assistant:

static void jsonRemoveAllNulls(JsonNode *pNode){
  int i, n;
  assert( pNode->eType==JSON_OBJECT );
  n = pNode->n;
  for(i=2; i<=n; i += jsonNodeSize(&pNode[i])+1){
    switch( pNode[i].eType ){
      case JSON_NULL:
        pNode[i].jnFlags |= JNODE_REMOVE;
        break;
      case JSON_OBJECT:
        jsonRemoveAllNulls(&pNode[i]);
        break;
    }
  }
}